

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localenc.c
# Opt level: O1

int charset_from_localenc(char *name)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long in_RAX;
  __int32_t **pp_Var4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined8 uStack_38;
  
  iVar3 = charset_from_mimeenc(name);
  if ((iVar3 == 0) && (iVar3 = charset_from_xenc(name), iVar3 == 0)) {
    lVar6 = 0;
    uStack_38 = in_RAX;
    do {
      pcVar1 = localencs[lVar6].name;
      lVar7 = 0;
      while (((uVar5 = (ulong)(byte)name[lVar7], uVar5 != 0 || (pcVar1[lVar7] != '\0')) &&
             (pp_Var4 = __ctype_tolower_loc(), (*pp_Var4)[uVar5] == (*pp_Var4)[(byte)pcVar1[lVar7]])
             )) {
        lVar7 = lVar7 + 1;
      }
      bVar2 = true;
      if ((uVar5 == 0) && (pcVar1[lVar7] == '\0')) {
        uStack_38 = (ulong)(uint)localencs[lVar6].charset << 0x20;
        bVar2 = false;
      }
      if (!bVar2) {
        return uStack_38._4_4_;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x38);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int charset_from_localenc(const char *name)
{
    int i;

    if ( (i = charset_from_mimeenc(name)) != CS_NONE)
        return i;
    if ( (i = charset_from_xenc(name)) != CS_NONE)
        return i;

    for (i = 0; i < (int)lenof(localencs); i++) {
        const char *p, *q;
        p = name;
        q = localencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return localencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}